

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O2

ze_result_t
validation_layer::zesVFManagementGetVFMemoryUtilizationExp
          (zes_vf_handle_t hVFhandle,uint32_t *pCount,zes_vf_util_mem_exp_t *pMemUtil)

{
  Logger *this;
  long *plVar1;
  ze_result_t result;
  ze_result_t zVar2;
  long lVar3;
  size_t i;
  long lVar4;
  long lVar5;
  allocator local_59;
  code *local_58;
  string local_50;
  
  lVar5 = context;
  this = *(Logger **)(context + 0xd50);
  std::__cxx11::string::string
            ((string *)&local_50,
             "zesVFManagementGetVFMemoryUtilizationExp(hVFhandle, pCount, pMemUtil)",&local_59);
  loader::Logger::log_trace(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (*(code **)(lVar5 + 0xcf0) == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar3 = *(long *)(lVar5 + 0xd38) - *(long *)(lVar5 + 0xd30) >> 3;
    lVar4 = 0;
    local_58 = *(code **)(lVar5 + 0xcf0);
    do {
      if (lVar3 == lVar4) {
        if ((*(char *)(context + 4) != '\x01') ||
           (result = ZESHandleLifetimeValidation::zesVFManagementGetVFMemoryUtilizationExpPrologue
                               ((ZESHandleLifetimeValidation *)(*(long *)(context + 0xd48) + 8),
                                hVFhandle,pCount,pMemUtil), result == ZE_RESULT_SUCCESS)) {
          zVar2 = (*local_58)(hVFhandle,pCount,pMemUtil);
          lVar5 = 0;
          goto LAB_001737aa;
        }
        break;
      }
      plVar1 = *(long **)(*(long *)(*(long *)(context + 0xd30) + lVar4 * 8) + 8);
      result = (**(code **)(*plVar1 + 0x8c0))(plVar1,hVFhandle,pCount,pMemUtil);
      lVar4 = lVar4 + 1;
    } while (result == ZE_RESULT_SUCCESS);
  }
  goto LAB_001737e3;
  while( true ) {
    plVar1 = *(long **)(*(long *)(*(long *)(context + 0xd30) + lVar5 * 8) + 8);
    result = (**(code **)(*plVar1 + 0x8c8))(plVar1,hVFhandle,pCount,pMemUtil,zVar2);
    lVar5 = lVar5 + 1;
    if (result != ZE_RESULT_SUCCESS) break;
LAB_001737aa:
    result = zVar2;
    if (lVar3 == lVar5) break;
  }
LAB_001737e3:
  logAndPropagateResult("zesVFManagementGetVFMemoryUtilizationExp",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesVFManagementGetVFMemoryUtilizationExp(
        zes_vf_handle_t hVFhandle,                      ///< [in] Sysman handle for the component.
        uint32_t* pCount,                               ///< [in,out] Pointer to the number of VF memory stats descriptors.
                                                        ///<  - if count is zero, the driver shall update the value with the total
                                                        ///< number of memory stats available.
                                                        ///<  - if count is greater than the total number of memory stats
                                                        ///< available, the driver shall update the value with the correct number
                                                        ///< of memory stats available.
                                                        ///<  - The count returned is the sum of number of VF instances currently
                                                        ///< available and the PF instance.
        zes_vf_util_mem_exp_t* pMemUtil                 ///< [in,out][optional][range(0, *pCount)] array of memory group activity counters.
                                                        ///<  - if count is less than the total number of memory stats available,
                                                        ///< then driver shall only retrieve that number of stats.
                                                        ///<  - the implementation shall populate the vector pCount-1 number of VF
                                                        ///< memory stats.
        )
    {
        context.logger->log_trace("zesVFManagementGetVFMemoryUtilizationExp(hVFhandle, pCount, pMemUtil)");

        auto pfnGetVFMemoryUtilizationExp = context.zesDdiTable.VFManagementExp.pfnGetVFMemoryUtilizationExp;

        if( nullptr == pfnGetVFMemoryUtilizationExp )
            return logAndPropagateResult("zesVFManagementGetVFMemoryUtilizationExp", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesVFManagementGetVFMemoryUtilizationExpPrologue( hVFhandle, pCount, pMemUtil );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesVFManagementGetVFMemoryUtilizationExp", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zesHandleLifetime.zesVFManagementGetVFMemoryUtilizationExpPrologue( hVFhandle, pCount, pMemUtil );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesVFManagementGetVFMemoryUtilizationExp", result);
        }

        auto driver_result = pfnGetVFMemoryUtilizationExp( hVFhandle, pCount, pMemUtil );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesVFManagementGetVFMemoryUtilizationExpEpilogue( hVFhandle, pCount, pMemUtil ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesVFManagementGetVFMemoryUtilizationExp", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
        }
        return logAndPropagateResult("zesVFManagementGetVFMemoryUtilizationExp", driver_result);
    }